

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XYZFormat.cpp
# Opt level: O2

bool __thiscall OpenMD::XYZFormat::ReadMolecule(XYZFormat *this,istream *ifs)

{
  char *pcVar1;
  double dVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  ulong uVar7;
  long lVar8;
  XYZAtom *this_00;
  ostream *poVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  uint natoms;
  char *endptr;
  XYZAtom *atom;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vs;
  string local_8278;
  XYZFormat *local_8258;
  double local_8250;
  double local_8248;
  char *local_8240;
  string readTitle;
  StringTokenizer tokenizer;
  stringstream errorMsg;
  ostream local_81b0 [376];
  char buffer [32768];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&errorMsg);
  if (((&ifs->field_0x20)[(long)ifs->_vptr_basic_istream[-3]] & 5) == 0) {
    plVar6 = (long *)std::istream::getline((char *)ifs,(long)buffer);
    if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) {
      builtin_strncpy(painCave.errMsg + 0x30,"rst line.\n",0xb);
      builtin_strncpy(painCave.errMsg + 0x20,"nnot read the fi",0x10);
      builtin_strncpy(painCave.errMsg + 0x10," an XYZ file: Ca",0x10);
      builtin_strncpy(painCave.errMsg,"Problems reading",0x10);
      painCave.isFatal = 1;
      simError();
    }
    iVar4 = __isoc99_sscanf(buffer,"%d",&natoms);
    if (iVar4 == 0 || natoms == 0) {
      memcpy(&painCave,
             "Problems reading an XYZ file: The first line must contain the number of atoms.\n",0x50
            );
      painCave.isFatal = 1;
      simError();
    }
    std::vector<OpenMD::XYZAtom_*,_std::allocator<OpenMD::XYZAtom_*>_>::reserve
              (&this->mol_,(ulong)natoms);
    plVar6 = (long *)std::istream::getline((char *)ifs,(long)buffer);
    if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) {
      memcpy(&painCave,
             "Problems reading an XYZ file: Could not read the second line (title/comments).\n",0x50
            );
      painCave.isFatal = 1;
      simError();
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&readTitle,buffer,(allocator<char> *)&tokenizer);
    uVar7 = std::__cxx11::string::find((char *)&readTitle,0x1cde72);
    if (uVar7 != 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)&readTitle,uVar7);
    }
    std::locale::locale((locale *)&tokenizer);
    Utils::trim(&readTitle,(locale *)&tokenizer);
    std::locale::~locale((locale *)&tokenizer);
    lVar8 = std::__cxx11::string::find_first_not_of((char *)&readTitle,0x1c65d3);
    if (lVar8 == -1) {
      std::__cxx11::string::assign((char *)&this->title_);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&this->title_);
    }
    local_8258 = this;
    for (iVar4 = 3; bVar10 = natoms < iVar4 - 2U, iVar4 - 2U <= natoms; iVar4 = iVar4 + 1) {
      plVar6 = (long *)std::istream::getline((char *)ifs,(long)buffer);
      if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) {
        poVar9 = std::operator<<(local_81b0,"Problems reading an XYZ file: ");
        poVar9 = std::operator<<(poVar9,"Could not read line #");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9,", file error.\n");
        poVar9 = std::operator<<(poVar9," According to line one, there should be ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9," atoms, and therefore ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::operator<<(poVar9," lines in the file.");
        std::__cxx11::stringbuf::str();
        strcpy(painCave.errMsg,tokenizer.tokenString_._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&tokenizer);
        painCave.isFatal = 0;
        painCave.severity = 2;
        simError();
        goto LAB_00191139;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8278,buffer,(allocator<char> *)&atom);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vs," ;,\t\n\r",(allocator<char> *)&endptr);
      StringTokenizer::StringTokenizer(&tokenizer,&local_8278,(string *)&vs);
      std::__cxx11::string::~string((string *)&vs);
      std::__cxx11::string::~string((string *)&local_8278);
      StringTokenizer::getAllTokens_abi_cxx11_(&vs,&tokenizer);
      if ((ulong)((long)vs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)vs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x80) {
        poVar9 = std::operator<<(local_81b0,"Problems reading an XYZ file: ");
        poVar9 = std::operator<<(poVar9,"Could not read line #");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9,".\n");
        poVar9 = std::operator<<(poVar9,"OpenBabel found the line \'");
        poVar9 = std::operator<<(poVar9,buffer);
        poVar9 = std::operator<<(poVar9,"\'\n");
        poVar9 = std::operator<<(poVar9,
                                 "According to the specifications, this line should contain exactly 4 entries, separated by white space.\n"
                                );
        poVar9 = std::operator<<(poVar9,"However, OpenBabel found ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::operator<<(poVar9," items.");
        std::__cxx11::stringbuf::str();
        strcpy(painCave.errMsg,local_8278._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_8278);
        painCave.isFatal = 0;
        painCave.severity = 2;
        simError();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vs);
        StringTokenizer::~StringTokenizer(&tokenizer);
        goto LAB_00191139;
      }
      this_00 = (XYZAtom *)operator_new(0x48);
      *(undefined8 *)((long)&(this_00->type).field_2 + 8) = 0;
      *(undefined8 *)&this_00->atomicNum = 0;
      (this_00->type)._M_string_length = 0;
      (this_00->type).field_2._M_allocated_capacity = 0;
      (this_00->pos).super_Vector<double,_3U>.data_[2] = 0.0;
      (this_00->type)._M_dataplus._M_p = (pointer)0x0;
      (this_00->pos).super_Vector<double,_3U>.data_[0] = 0.0;
      (this_00->pos).super_Vector<double,_3U>.data_[1] = 0.0;
      this_00->charge = 0.0;
      XYZAtom::XYZAtom(this_00);
      atom = this_00;
      std::vector<OpenMD::XYZAtom_*,_std::allocator<OpenMD::XYZAtom_*>_>::push_back
                (&local_8258->mol_,&atom);
      iVar5 = ElementsTable::GetAtomicNum
                        ((ElementsTable *)etab,
                         ((vs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
      if (iVar5 == 0) {
        iVar5 = atoi(((vs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
        atom->atomicNum = iVar5;
        if (iVar5 == 0) {
          std::__cxx11::string::_M_assign((string *)&atom->type);
        }
      }
      else {
        atom->atomicNum = iVar5;
      }
      local_8240 = (char *)strtod(vs.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                                  &endptr);
      if (endptr == vs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p) {
        poVar9 = std::operator<<(local_81b0,"Problems reading an XYZ file: ");
        poVar9 = std::operator<<(poVar9,"Could not read line #");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9,".\n");
        poVar9 = std::operator<<(poVar9,"OpenBabel found the line \'");
        poVar9 = std::operator<<(poVar9,buffer);
        poVar9 = std::operator<<(poVar9,"\'\n");
        poVar9 = std::operator<<(poVar9,
                                 "According to the specifications, this line should contain exactly 4 entries, separated by white space.\n"
                                );
        std::operator<<(poVar9,"OpenBabel could not interpret item #1 as a number.");
        std::__cxx11::stringbuf::str();
        strcpy(painCave.errMsg,local_8278._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_8278);
        painCave.isFatal = 1;
        simError();
      }
      local_8248 = strtod(vs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,&endptr);
      if (endptr == vs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p) {
        poVar9 = std::operator<<(local_81b0,"Problems reading an XYZ file: ");
        poVar9 = std::operator<<(poVar9,"Could not read line #");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9,".\n");
        poVar9 = std::operator<<(poVar9,"OpenBabel found the line \'");
        poVar9 = std::operator<<(poVar9,buffer);
        poVar9 = std::operator<<(poVar9,"\'\n");
        poVar9 = std::operator<<(poVar9,
                                 "According to the specifications, this line should contain exactly 4 entries, separated by white space.\n"
                                );
        std::operator<<(poVar9,"OpenBabel could not interpret item #2 as a number.");
        std::__cxx11::stringbuf::str();
        strcpy(painCave.errMsg,local_8278._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_8278);
        painCave.isFatal = 1;
        simError();
      }
      dVar2 = strtod(vs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p,&endptr);
      pcVar3 = endptr;
      pcVar1 = vs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
      if (endptr == pcVar1) {
        poVar9 = std::operator<<(local_81b0,"Problems reading an XYZ file: ");
        poVar9 = std::operator<<(poVar9,"Could not read line #");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9,".\n");
        poVar9 = std::operator<<(poVar9,"OpenBabel found the line \'");
        poVar9 = std::operator<<(poVar9,buffer);
        poVar9 = std::operator<<(poVar9,"\'\n");
        poVar9 = std::operator<<(poVar9,
                                 "According to the specifications, this line should contain exactly 4 entries, separated by white space.\n"
                                );
        std::operator<<(poVar9,"OpenBabel could not interpret item #3 as a number.");
        std::__cxx11::stringbuf::str();
        strcpy(painCave.errMsg,local_8278._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_8278);
        painCave.isFatal = 0;
        painCave.severity = 2;
        simError();
      }
      else {
        local_8250 = dVar2;
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_8278);
        local_8278._M_dataplus._M_p = local_8240;
        local_8278._M_string_length = (size_type)local_8248;
        local_8278.field_2._M_allocated_capacity = (size_type)local_8250;
        Vector<double,_3U>::operator=((Vector<double,_3U> *)atom,(Vector<double,_3U> *)&local_8278);
        if (0xa0 < (ulong)((long)vs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)vs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          lVar8 = std::__cxx11::string::find
                            ((char)vs.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + -0x80,0x2e);
          if (lVar8 != -1) {
            dVar2 = strtod(vs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p,&endptr);
            if (endptr != vs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p) {
              atom->charge = dVar2;
            }
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vs);
      StringTokenizer::~StringTokenizer(&tokenizer);
      if (pcVar3 == pcVar1) goto LAB_00191139;
    }
    do {
      auVar11 = std::istream::tellg();
      std::istream::getline((char *)ifs,(long)buffer);
      if (buffer[0] != '\0') break;
    } while (((&ifs->field_0x20)[(long)ifs->_vptr_basic_istream[-3]] & 2) == 0);
    std::istream::seekg(ifs,auVar11._0_8_,auVar11._8_8_);
LAB_00191139:
    std::__cxx11::string::~string((string *)&readTitle);
  }
  else {
    bVar10 = false;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&errorMsg);
  return bVar10;
}

Assistant:

bool XYZFormat::ReadMolecule(std::istream& ifs) {
    char buffer[BUFF_SIZE];
    unsigned int natoms;
    std::stringstream errorMsg;

    if (!ifs)
      return false;  // we're attempting to read past the end of the file

    if (!ifs.getline(buffer, BUFF_SIZE)) {
      strcpy(painCave.errMsg,
             "Problems reading an XYZ file: Cannot read the first line.\n");
      painCave.isFatal = 1;
      simError();
    }

    if (sscanf(buffer, "%d", &natoms) == 0 || !natoms) {
      strcpy(painCave.errMsg, "Problems reading an XYZ file: The first line "
                              "must contain the number of atoms.\n");
      painCave.isFatal = 1;
      simError();
    }

    mol_.reserve(natoms);

    // The next line contains a title string for the molecule. Use this
    // as the title for the molecule if the line is not
    // empty. Otherwise, use the title given by the calling function.
    if (!ifs.getline(buffer, BUFF_SIZE)) {
      strcpy(painCave.errMsg, "Problems reading an XYZ file: Could not read "
                              "the second line (title/comments).\n");
      painCave.isFatal = 1;
      simError();
    }
    std::string readTitle(buffer);
    std::string::size_type location = readTitle.find("Energy");
    if (location != std::string::npos) readTitle.erase(location);
    Utils::trim(readTitle);

    location = readTitle.find_first_not_of(" \t\n\r");
    if (location != std::string::npos)
      title_ = readTitle;
    else
      title_ = "";

    // The next lines contain four items each, separated by white
    // spaces: the atom type, and the coordinates of the atom
    for (unsigned int i = 1; i <= natoms; i++) {
      if (!ifs.getline(buffer, BUFF_SIZE)) {
        errorMsg << "Problems reading an XYZ file: "
                 << "Could not read line #" << i + 2 << ", file error.\n"
                 << " According to line one, there should be " << natoms
                 << " atoms, and therefore " << natoms + 2
                 << " lines in the file.";

        strcpy(painCave.errMsg, errorMsg.str().c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
        return (false);
      }
      StringTokenizer tokenizer(buffer, " ;,\t\n\r");
      std::vector<std::string> vs = tokenizer.getAllTokens();
      if (vs.size() < 4)  // ignore extra columns which some applications add
      {
        errorMsg << "Problems reading an XYZ file: "
                 << "Could not read line #" << i + 2 << ".\n"
                 << "OpenBabel found the line '" << buffer << "'\n"
                 << "According to the specifications, this line should contain "
                    "exactly 4 entries, separated by white space.\n"
                 << "However, OpenBabel found " << vs.size() << " items.";

        strcpy(painCave.errMsg, errorMsg.str().c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
        return (false);
      }

      // Atom Type: get the atomic number from the element table, using
      // the first entry in the currently read line. If the entry makes
      // sense, set the atomic number and leave the atomic type open
      // (the type is then later faulted in when atom->GetType() is
      // called). If the entry does not make sense to use, set the atom
      // type manually, assuming that the author of the xyz-file had
      // something "special" in mind.

      XYZAtom* atom = new XYZAtom();
      mol_.push_back(atom);

      int atomicNum = etab.GetAtomicNum(vs[0].c_str());
      // set atomic number, or '0' if the atom type is not recognized
      if (atomicNum == 0) {
        // Sometimes people call this an XYZ file, but it's actually Unichem
        // i.e., the first column is the atomic number, not a symbol
        // so we'll first check if we can convert this to an element number
        atomicNum = atoi(vs[0].c_str());
      }

      atom->atomicNum = atomicNum;
      if (atomicNum == 0)  // still strange, try using an atom type
        atom->type = vs[0];

      // Read the atom coordinates
      char* endptr;
      double x = strtod((char*)vs[1].c_str(), &endptr);
      if (endptr == (char*)vs[1].c_str()) {
        errorMsg << "Problems reading an XYZ file: "
                 << "Could not read line #" << i + 2 << ".\n"
                 << "OpenBabel found the line '" << buffer << "'\n"
                 << "According to the specifications, this line should contain "
                    "exactly 4 entries, separated by white space.\n"
                 << "OpenBabel could not interpret item #1 as a number.";

        strcpy(painCave.errMsg, errorMsg.str().c_str());
        painCave.isFatal = 1;
        simError();
      }
      double y = strtod((char*)vs[2].c_str(), &endptr);
      if (endptr == (char*)vs[2].c_str()) {
        errorMsg << "Problems reading an XYZ file: "
                 << "Could not read line #" << i + 2 << ".\n"
                 << "OpenBabel found the line '" << buffer << "'\n"
                 << "According to the specifications, this line should contain "
                    "exactly 4 entries, separated by white space.\n"
                 << "OpenBabel could not interpret item #2 as a number.";

        strcpy(painCave.errMsg, errorMsg.str().c_str());
        painCave.isFatal = 1;
        simError();
      }
      double z = strtod((char*)vs[3].c_str(), &endptr);
      if (endptr == (char*)vs[3].c_str()) {
        errorMsg << "Problems reading an XYZ file: "
                 << "Could not read line #" << i + 2 << ".\n"
                 << "OpenBabel found the line '" << buffer << "'\n"
                 << "According to the specifications, this line should contain "
                    "exactly 4 entries, separated by white space.\n"
                 << "OpenBabel could not interpret item #3 as a number.";

        strcpy(painCave.errMsg, errorMsg.str().c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
        return (false);
      }
      atom->pos = Vector3d(x, y, z);  // set coordinates

      // OK, sometimes there's sym x y z charge -- accepted by Jmol
      if (vs.size() > 5) {
        std::string::size_type decimal = vs[4].find('.');
        if (decimal != std::string::npos) {  // period found
          double charge = strtod((char*)vs[4].c_str(), &endptr);
          if (endptr != (char*)vs[4].c_str()) atom->charge = charge;
        }
      }  // attempt to parse charges
    }

    // clean out any remaining blank lines
    std::streampos ipos;
    do {
      ipos = ifs.tellg();
      ifs.getline(buffer, BUFF_SIZE);
    } while (strlen(buffer) == 0 && !ifs.eof());
    ifs.seekg(ipos);
    return (true);
  }